

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_sequence_infos(HL1MDLLoader *this)

{
  int iVar1;
  uint uVar2;
  Header_HL1 *pHVar3;
  pointer pbVar4;
  bool bVar5;
  aiNode *paVar6;
  aiNode **ppaVar7;
  aiMetadata *paVar8;
  HL1ImportSettings *pHVar9;
  Logger *this_00;
  size_t sVar10;
  long lVar11;
  int *value;
  char *value_00;
  uint j;
  ulong uVar12;
  char *local_608;
  allocator<char> local_5f6;
  allocator<char> local_5f5;
  int animation_index;
  aiNode *local_5f0;
  aiNode *blend_controllers_node;
  undefined4 local_5e0;
  int num_blend_controllers;
  undefined4 uStack_5c4;
  ulong local_5c0;
  vector<aiNode_*,_std::allocator<aiNode_*>_> sequence_info_node_children;
  aiNode *pEventsNode;
  int *local_570;
  aiNode *sequence_infos_node;
  long local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_498;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  aiString local_438;
  
  pHVar3 = this->header_;
  if (pHVar3->numseq != 0) {
    iVar1 = pHVar3->seqindex;
    paVar6 = (aiNode *)operator_new(0x478);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"<MDL_sequence_infos>",
               (allocator<char> *)&blend_controllers_node);
    aiNode::aiNode(paVar6,(string *)&local_438);
    local_608 = (pHVar3->super_HalfLifeMDLBaseHeader).ident + iVar1;
    std::__cxx11::string::~string((string *)&local_438);
    sequence_infos_node = paVar6;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              (&this->rootnode_children_,&sequence_infos_node);
    paVar6 = sequence_infos_node;
    uVar2 = this->header_->numseq;
    sequence_infos_node->mNumChildren = uVar2;
    ppaVar7 = (aiNode **)operator_new__((ulong)uVar2 << 3);
    paVar6->mChildren = ppaVar7;
    sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    animation_index = 0;
    sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_570 = (int *)((long)pHVar3->bbmax + (long)iVar1 + 4);
    lVar11 = 0;
    while (lVar11 < this->header_->numseq) {
      if (sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      paVar6 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar6,(this->unique_sequence_names_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar11);
      sequence_infos_node->mChildren[lVar11] = paVar6;
      paVar6->mParent = sequence_infos_node;
      local_560 = lVar11;
      paVar8 = aiMetadata::Alloc(0x10);
      paVar6->mMetaData = paVar8;
      local_5f0 = paVar6;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"AnimationIndex",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,0,(string *)&local_438,&animation_index);
      std::__cxx11::string::~string((string *)&local_438);
      animation_index = animation_index + *(int *)(local_608 + 0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blend_controllers_node,"SequenceGroup",
                 (allocator<char> *)&num_blend_controllers);
      pbVar4 = (this->unique_sequence_groups_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = pbVar4[*(int *)(local_608 + 0x9c)]._M_string_length;
      sVar10 = uVar12 & 0xffffffff;
      if ((uVar12 & 0xfffffc00) != 0) {
        sVar10 = 0x3ff;
      }
      local_438.length = (ai_uint32)sVar10;
      memcpy(local_438.data,pbVar4[*(int *)(local_608 + 0x9c)]._M_dataplus._M_p,sVar10);
      local_438.data[sVar10] = '\0';
      aiMetadata::Set<aiString>
                (paVar8,1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &blend_controllers_node,&local_438);
      std::__cxx11::string::~string((string *)&blend_controllers_node);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"FramesPerSecond",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<float>(paVar8,2,(string *)&local_438,(float *)(local_608 + 0x20));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"NumFrames",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,3,(string *)&local_438,(int *)(local_608 + 0x38));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"NumBlends",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,4,(string *)&local_438,(int *)(local_608 + 0x78));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"Activity",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,5,(string *)&local_438,(int *)(local_608 + 0x28));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"ActivityWeight",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,6,(string *)&local_438,(int *)(local_608 + 0x2c));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"MotionFlags",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,7,(string *)&local_438,(int *)(local_608 + 0x44));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"MotionBone",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<aiString>
                (paVar8,8,(string *)&local_438,
                 &((this->temp_bones_).
                   super__Vector_base<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
                   ._M_impl.super__Vector_impl_data._M_start[*(int *)(local_608 + 0x48)].node)->
                  mName);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"LinearMovement",(allocator<char> *)&num_blend_controllers);
      local_5e0 = *(undefined4 *)(local_608 + 0x54);
      blend_controllers_node = *(aiNode **)(local_608 + 0x4c);
      aiMetadata::Set<aiVector3t<float>>
                (paVar8,9,(string *)&local_438,(aiVector3t<float> *)&blend_controllers_node);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"BBMin",(allocator<char> *)&num_blend_controllers);
      local_5e0 = *(undefined4 *)(local_608 + 0x68);
      blend_controllers_node = *(aiNode **)(local_608 + 0x60);
      aiMetadata::Set<aiVector3t<float>>
                (paVar8,10,(string *)&local_438,(aiVector3t<float> *)&blend_controllers_node);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"BBMax",(allocator<char> *)&num_blend_controllers);
      local_5e0 = *(undefined4 *)(local_608 + 0x74);
      blend_controllers_node = *(aiNode **)(local_608 + 0x6c);
      aiMetadata::Set<aiVector3t<float>>
                (paVar8,0xb,(string *)&local_438,(aiVector3t<float> *)&blend_controllers_node);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"EntryNode",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,0xc,(string *)&local_438,(int *)(local_608 + 0xa0));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"ExitNode",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,0xd,(string *)&local_438,(int *)(local_608 + 0xa4));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"NodeFlags",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,0xe,(string *)&local_438,(int *)(local_608 + 0xa8));
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"Flags",(allocator<char> *)&blend_controllers_node);
      aiMetadata::Set<int>(paVar8,0xf,(string *)&local_438,(int *)(local_608 + 0x24));
      std::__cxx11::string::~string((string *)&local_438);
      pHVar9 = this->import_settings_;
      if (pHVar9->read_blend_controllers == true) {
        bVar5 = get_num_blend_controllers(*(int *)(local_608 + 0x78),&num_blend_controllers);
        iVar1 = num_blend_controllers;
        if (bVar5 && num_blend_controllers != 0) {
          paVar6 = (aiNode *)operator_new(0x478);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_438,"BlendControllers",(allocator<char> *)&pEventsNode);
          aiNode::aiNode(paVar6,(string *)&local_438);
          std::__cxx11::string::~string((string *)&local_438);
          blend_controllers_node = paVar6;
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    (&sequence_info_node_children,(value_type *)&blend_controllers_node);
          paVar6 = blend_controllers_node;
          blend_controllers_node->mParent = local_5f0;
          blend_controllers_node->mNumChildren = iVar1;
          ppaVar7 = (aiNode **)operator_new__((ulong)(uint)iVar1 << 3);
          paVar6->mChildren = ppaVar7;
          value = local_570;
          for (uVar12 = 0; uVar12 < paVar6->mNumChildren; uVar12 = uVar12 + 1) {
            paVar6 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar6);
            blend_controllers_node->mChildren[uVar12] = paVar6;
            paVar6->mParent = blend_controllers_node;
            paVar8 = aiMetadata::Alloc(3);
            paVar6->mMetaData = paVar8;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_438,"Start",(allocator<char> *)&pEventsNode);
            aiMetadata::Set<float>(paVar8,0,(string *)&local_438,(float *)(value + 2));
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_438,"End",(allocator<char> *)&pEventsNode);
            aiMetadata::Set<float>(paVar8,1,(string *)&local_438,(float *)(value + 4));
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_438,"MotionFlags",(allocator<char> *)&pEventsNode);
            aiMetadata::Set<int>(paVar8,2,(string *)&local_438,value);
            std::__cxx11::string::~string((string *)&local_438);
            value = value + 1;
            paVar6 = blend_controllers_node;
          }
        }
        pHVar9 = this->import_settings_;
      }
      if ((pHVar9->read_animation_events == true) && (*(int *)(local_608 + 0x30) != 0)) {
        if (0x400 < *(int *)(local_608 + 0x30)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4b8,local_608,&local_5f5);
          std::operator+(&local_538,"Sequence ",&local_4b8);
          iVar1 = *(int *)(local_608 + 0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_558,"animation events",&local_5f6);
          this_00 = DefaultLogger::get();
          std::operator+(&local_458,"[Half-Life 1 MDL] ",&local_538);
          std::operator+(&local_518,&local_458," has ");
          std::__cxx11::to_string(&local_478,iVar1);
          std::operator+(&local_4f8,&local_518,&local_478);
          std::operator+(&local_4d8,&local_4f8," ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pEventsNode,&local_4d8,&local_558);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &num_blend_controllers,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pEventsNode,", which exceeds the limit (");
          std::__cxx11::to_string(&local_498,0x400);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &blend_controllers_node,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &num_blend_controllers,&local_498);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_438,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &blend_controllers_node,")");
          Logger::warn(this_00,(char *)CONCAT44(local_438.data._0_4_,local_438.length));
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&blend_controllers_node);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&num_blend_controllers);
          std::__cxx11::string::~string((string *)&pEventsNode);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&local_558);
          std::__cxx11::string::~string((string *)&local_538);
          std::__cxx11::string::~string((string *)&local_4b8);
        }
        value_00 = (this->header_->super_HalfLifeMDLBaseHeader).ident + *(int *)(local_608 + 0x34);
        paVar6 = (aiNode *)operator_new(0x478);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,"AnimationEvents",(allocator<char> *)&blend_controllers_node
                  );
        aiNode::aiNode(paVar6,(string *)&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        pEventsNode = paVar6;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  (&sequence_info_node_children,&pEventsNode);
        paVar6 = pEventsNode;
        pEventsNode->mParent = local_5f0;
        uVar2 = *(uint *)(local_608 + 0x30);
        pEventsNode->mNumChildren = uVar2;
        ppaVar7 = (aiNode **)operator_new__((ulong)uVar2 << 3);
        paVar6->mChildren = ppaVar7;
        for (uVar12 = 0; uVar12 < paVar6->mNumChildren; uVar12 = uVar12 + 1) {
          paVar6 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar6);
          pEventsNode->mChildren[uVar12] = paVar6;
          paVar6->mParent = pEventsNode;
          paVar8 = aiMetadata::Alloc(3);
          paVar6->mMetaData = paVar8;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_438,"Frame",(allocator<char> *)&blend_controllers_node);
          aiMetadata::Set<int>(paVar8,0,(string *)&local_438,(int *)value_00);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_438,"ScriptEvent",(allocator<char> *)&blend_controllers_node);
          aiMetadata::Set<int>(paVar8,1,(string *)&local_438,(int *)(value_00 + 4));
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&blend_controllers_node,"Options",(allocator<char> *)&local_4d8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&num_blend_controllers,value_00 + 0xc,(allocator<char> *)&local_4f8);
          sVar10 = local_5c0 & 0xffffffff;
          if ((local_5c0 & 0xfffffc00) != 0) {
            sVar10 = 0x3ff;
          }
          local_438.length = (ai_uint32)sVar10;
          memcpy(local_438.data,(void *)CONCAT44(uStack_5c4,num_blend_controllers),sVar10);
          local_438.data[sVar10] = '\0';
          aiMetadata::Set<aiString>
                    (paVar8,2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &blend_controllers_node,&local_438);
          std::__cxx11::string::~string((string *)&num_blend_controllers);
          std::__cxx11::string::~string((string *)&blend_controllers_node);
          value_00 = value_00 + 0x4c;
          paVar6 = pEventsNode;
        }
      }
      if ((long)sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        aiNode::addChildren(local_5f0,
                            (uint)((ulong)((long)sequence_info_node_children.
                                                 super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)sequence_info_node_children.
                                                super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3),
                            sequence_info_node_children.
                            super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
      }
      local_608 = local_608 + 0xb0;
      local_570 = local_570 + 0x2c;
      lVar11 = local_560 + 1;
    }
    std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base
              (&sequence_info_node_children.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)
    ;
  }
  return;
}

Assistant:

void HL1MDLLoader::read_sequence_infos() {
    if (!header_->numseq)
        return;

    const SequenceDesc_HL1 *pseqdesc = (const SequenceDesc_HL1 *)((uint8_t *)header_ + header_->seqindex);

    aiNode *sequence_infos_node = new aiNode(AI_MDL_HL1_NODE_SEQUENCE_INFOS);
    rootnode_children_.push_back(sequence_infos_node);

    sequence_infos_node->mNumChildren = static_cast<unsigned int>(header_->numseq);
    sequence_infos_node->mChildren = new aiNode *[sequence_infos_node->mNumChildren];

    std::vector<aiNode *> sequence_info_node_children;

    int animation_index = 0;
    for (int i = 0; i < header_->numseq; ++i, ++pseqdesc) {
        // Clear the list of children for the upcoming sequence info node.
        sequence_info_node_children.clear();

        aiNode *sequence_info_node = sequence_infos_node->mChildren[i] = new aiNode(unique_sequence_names_[i]);
        sequence_info_node->mParent = sequence_infos_node;

        // Setup sequence info node Metadata.
        aiMetadata *md = sequence_info_node->mMetaData = aiMetadata::Alloc(16);
        md->Set(0, "AnimationIndex", animation_index);
        animation_index += pseqdesc->numblends;

        // Reference the sequence group by name. This allows us to search a particular
        // sequence group by name using aiNode(s).
        md->Set(1, "SequenceGroup", aiString(unique_sequence_groups_names_[pseqdesc->seqgroup]));
        md->Set(2, "FramesPerSecond", pseqdesc->fps);
        md->Set(3, "NumFrames", pseqdesc->numframes);
        md->Set(4, "NumBlends", pseqdesc->numblends);
        md->Set(5, "Activity", pseqdesc->activity);
        md->Set(6, "ActivityWeight", pseqdesc->actweight);
        md->Set(7, "MotionFlags", pseqdesc->motiontype);
        md->Set(8, "MotionBone", temp_bones_[pseqdesc->motionbone].node->mName);
        md->Set(9, "LinearMovement", aiVector3D(pseqdesc->linearmovement[0], pseqdesc->linearmovement[1], pseqdesc->linearmovement[2]));
        md->Set(10, "BBMin", aiVector3D(pseqdesc->bbmin[0], pseqdesc->bbmin[1], pseqdesc->bbmin[2]));
        md->Set(11, "BBMax", aiVector3D(pseqdesc->bbmax[0], pseqdesc->bbmax[1], pseqdesc->bbmax[2]));
        md->Set(12, "EntryNode", pseqdesc->entrynode);
        md->Set(13, "ExitNode", pseqdesc->exitnode);
        md->Set(14, "NodeFlags", pseqdesc->nodeflags);
        md->Set(15, "Flags", pseqdesc->flags);

        if (import_settings_.read_blend_controllers) {
            int num_blend_controllers;
            if (get_num_blend_controllers(pseqdesc->numblends, num_blend_controllers) && num_blend_controllers) {
                // Read blend controllers info.
                aiNode *blend_controllers_node = new aiNode(AI_MDL_HL1_NODE_BLEND_CONTROLLERS);
                sequence_info_node_children.push_back(blend_controllers_node);
                blend_controllers_node->mParent = sequence_info_node;
                blend_controllers_node->mNumChildren = static_cast<unsigned int>(num_blend_controllers);
                blend_controllers_node->mChildren = new aiNode *[blend_controllers_node->mNumChildren];

                for (unsigned int j = 0; j < blend_controllers_node->mNumChildren; ++j) {
                    aiNode *blend_controller_node = blend_controllers_node->mChildren[j] = new aiNode();
                    blend_controller_node->mParent = blend_controllers_node;

                    aiMetadata *md = blend_controller_node->mMetaData = aiMetadata::Alloc(3);
                    md->Set(0, "Start", pseqdesc->blendstart[j]);
                    md->Set(1, "End", pseqdesc->blendend[j]);
                    md->Set(2, "MotionFlags", pseqdesc->blendtype[j]);
                }
            }
        }

        if (import_settings_.read_animation_events && pseqdesc->numevents) {
            // Read animation events.

            if (pseqdesc->numevents > AI_MDL_HL1_MAX_EVENTS) {
                log_warning_limit_exceeded<AI_MDL_HL1_MAX_EVENTS>(
                        "Sequence " + std::string(pseqdesc->label),
                        pseqdesc->numevents, "animation events");
            }

            const AnimEvent_HL1 *pevent = (const AnimEvent_HL1 *)((uint8_t *)header_ + pseqdesc->eventindex);

            aiNode *pEventsNode = new aiNode(AI_MDL_HL1_NODE_ANIMATION_EVENTS);
            sequence_info_node_children.push_back(pEventsNode);
            pEventsNode->mParent = sequence_info_node;
            pEventsNode->mNumChildren = static_cast<unsigned int>(pseqdesc->numevents);
            pEventsNode->mChildren = new aiNode *[pEventsNode->mNumChildren];

            for (unsigned int j = 0; j < pEventsNode->mNumChildren; ++j, ++pevent) {
                aiNode *pEvent = pEventsNode->mChildren[j] = new aiNode();
                pEvent->mParent = pEventsNode;

                aiMetadata *md = pEvent->mMetaData = aiMetadata::Alloc(3);
                md->Set(0, "Frame", pevent->frame);
                md->Set(1, "ScriptEvent", pevent->event);
                md->Set(2, "Options", aiString(pevent->options));
            }
        }

        if (sequence_info_node_children.size()) {
            sequence_info_node->addChildren(
                    static_cast<unsigned int>(sequence_info_node_children.size()),
                    sequence_info_node_children.data());
        }
    }
}